

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O0

int Sbd_ManCutIsTopo_rec(Gia_Man_t *p,Vec_Int_t *vMirrors,int iObj)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj_00;
  bool local_39;
  int Ret1;
  int Ret0;
  Gia_Obj_t *pObj;
  int iObj_local;
  Vec_Int_t *vMirrors_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntEntry(vMirrors,iObj);
  pObj._4_4_ = iObj;
  if (-1 < iVar1) {
    iVar1 = Vec_IntEntry(vMirrors,iObj);
    pObj._4_4_ = Abc_Lit2Var(iVar1);
  }
  if ((pObj._4_4_ == 0) || (iVar1 = Gia_ObjIsTravIdCurrentId(p,pObj._4_4_), iVar1 != 0)) {
    p_local._4_4_ = 1;
  }
  else {
    Gia_ObjSetTravIdCurrentId(p,pObj._4_4_);
    pObj_00 = Gia_ManObj(p,pObj._4_4_);
    iVar1 = Gia_ObjIsCi(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj_00);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                      ,0x8e,"int Sbd_ManCutIsTopo_rec(Gia_Man_t *, Vec_Int_t *, int)");
      }
      iVar1 = Gia_ObjFaninId0(pObj_00,pObj._4_4_);
      iVar1 = Sbd_ManCutIsTopo_rec(p,vMirrors,iVar1);
      iVar2 = Gia_ObjFaninId1(pObj_00,pObj._4_4_);
      iVar2 = Sbd_ManCutIsTopo_rec(p,vMirrors,iVar2);
      local_39 = iVar1 != 0 && iVar2 != 0;
      p_local._4_4_ = (uint)local_39;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Sbd_ManCutIsTopo_rec( Gia_Man_t * p, Vec_Int_t * vMirrors, int iObj )
{
    Gia_Obj_t * pObj; 
    int Ret0, Ret1;
    if ( Vec_IntEntry(vMirrors, iObj) >= 0 )
        iObj = Abc_Lit2Var(Vec_IntEntry(vMirrors, iObj));
    if ( !iObj || Gia_ObjIsTravIdCurrentId(p, iObj) )
        return 1;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return 0;
    assert( Gia_ObjIsAnd(pObj) );
    Ret0 = Sbd_ManCutIsTopo_rec( p, vMirrors, Gia_ObjFaninId0(pObj, iObj) );
    Ret1 = Sbd_ManCutIsTopo_rec( p, vMirrors, Gia_ObjFaninId1(pObj, iObj) );
    return Ret0 && Ret1;
}